

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * atomopl(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  matches *pmVar1;
  match *pmVar2;
  
  if (ctx->reverse == 0) {
    ctx->oplen = *v;
    pmVar1 = (matches *)0x0;
  }
  else {
    pmVar1 = (matches *)calloc(0x10,1);
    pmVar1->mmax = 0x10;
    pmVar2 = (match *)malloc(0xb80);
    pmVar1->m = pmVar2;
    pmVar1->mnum = 1;
    *(undefined8 *)pmVar2 = 0;
    pmVar2->a[0] = 0;
    pmVar2->a[1] = 0;
    pmVar2->m[0] = 0;
    pmVar2->m[1] = 0;
    pmVar2->lpos = spos;
    memset(&pmVar2->field_0x2c,0,0x8c);
    pmVar2->oplen = *v;
  }
  return pmVar1;
}

Assistant:

struct matches *atomopl APROTO {
	if (!ctx->reverse) {
		ctx->oplen = *(int*)v;
		return NULL;
	} else {
		struct matches *res = alwaysmatches(spos);
		res->m[0].oplen = *(int*)v;
		return res;
	}
}